

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O2

void hash_init(hash *hash,int nbuckets,hash_hash_func *hash_func,hash_cmp_func *cmp_func)

{
  avl_tree *paVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  
  sVar4 = (size_t)nbuckets;
  hash->nbuckets = sVar4;
  paVar1 = (avl_tree *)malloc(sVar4 << 4);
  hash->buckets = paVar1;
  lVar3 = 0;
  for (uVar2 = 0; uVar2 < sVar4; uVar2 = uVar2 + 1) {
    avl_init((avl_tree *)((long)&hash->buckets->root + lVar3),hash);
    sVar4 = hash->nbuckets;
    lVar3 = lVar3 + 0x10;
  }
  hash->hash_func = hash_func;
  hash->cmp = cmp_func;
  return;
}

Assistant:

void hash_init(struct hash *hash, int nbuckets, hash_hash_func *hash_func, hash_cmp_func *cmp_func)
{
    size_t i;
    hash->nbuckets = nbuckets;
#ifdef _HASH_TREE
    hash->buckets = (struct avl_tree *)malloc(sizeof(struct avl_tree) * hash->nbuckets);
#else
    hash->buckets = (struct list *)malloc(sizeof(struct list) * hash->nbuckets);
#endif

    IFDEF_LOCK( hash->locks = (spin_t*)malloc(sizeof(spin_t) * hash->nbuckets) );

    for (i=0;i<hash->nbuckets;++i){
#ifdef _HASH_TREE
        avl_init(hash->buckets + i, (void *)hash);
#else
        list_init(hash->buckets + i);
#endif

        IFDEF_LOCK( spin_init(hash->locks + i); );
    }

    hash->hash_func = hash_func;
    hash->cmp = cmp_func;
}